

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O0

void __thiscall HTML::TAG::~TAG(TAG *this)

{
  ostream *poVar1;
  string local_30 [32];
  TAG *local_10;
  TAG *this_local;
  
  this->_vptr_TAG = (_func_int **)&PTR__TAG_0032fd50;
  poVar1 = this->m_stream;
  local_10 = this;
  std::__cxx11::stringstream::str();
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(this->m_stream,"</");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_tag);
  std::operator<<(poVar1,">");
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->m_value);
  std::__cxx11::string::~string((string *)&this->m_tag);
  return;
}

Assistant:

virtual ~TAG() {
    m_stream << m_value.str();
    m_stream << "</" << m_tag << ">";
  }